

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O0

void __thiscall
FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::FileInfoWrapper
          (FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *this,
          IFileReaderFactory *fileReaderFactory)

{
  IFileReaderFactory *fileReaderFactory_local;
  FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *this_local;
  
  this->_vptr_FileInfoWrapper = (_func_int **)&PTR__FileInfoWrapper_0012bb98;
  AS_02::JP2K::MXFReader::MXFReader(&this->m_Reader,fileReaderFactory);
  MyPictureDescriptor::MyPictureDescriptor(&this->m_Desc);
  ASDCP::WriterInfo::WriterInfo(&this->m_WriterInfo);
  this->m_MaxBitrate = 0.0;
  this->m_AvgBitrate = 0.0;
  ASDCP::UL::UL(&this->m_PictureEssenceCoding);
  return;
}

Assistant:

FileInfoWrapper(const IFileReaderFactory& fileReaderFactory) : m_MaxBitrate(0.0), m_AvgBitrate(0.0), m_Reader(fileReaderFactory) {}